

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token __thiscall slang::parsing::Lexer::lexApostrophe(Lexer *this)

{
  uint8_t value;
  char cVar1;
  bool bVar2;
  Lexer *in_RDI;
  LiteralBase base_1;
  LiteralBase base;
  char c;
  TokenKind in_stack_0000003e;
  Lexer *in_stack_00000040;
  undefined6 in_stack_00000048;
  TokenKind in_stack_0000004e;
  Lexer *in_stack_00000050;
  TokenKind in_stack_0000005e;
  Lexer *in_stack_00000060;
  LiteralBase local_1d [3];
  logic_t local_1a;
  char local_19;
  Token local_10;
  
  local_19 = peek(in_RDI);
  switch(local_19) {
  case '0':
  case '1':
    advance(in_RDI);
    value = getDigitValue(local_19);
    logic_t::logic_t(&local_1a,value);
    local_10 = create<slang::logic_t>
                         (in_stack_00000050,in_stack_0000004e,(logic_t *)in_stack_00000040);
    break;
  default:
    cVar1 = peek(in_RDI);
    bVar2 = literalBaseFromChar(cVar1,local_1d);
    if (bVar2) {
      advance(in_RDI);
      local_10 = create<slang::LiteralBase&,bool>
                           (in_stack_00000060,in_stack_0000005e,(LiteralBase *)in_stack_00000050,
                            (bool *)CONCAT26(in_stack_0000004e,in_stack_00000048));
    }
    else {
      local_10 = create<>(in_stack_00000040,in_stack_0000003e);
    }
    break;
  case 'S':
  case 's':
    advance(in_RDI);
    cVar1 = peek(in_RDI);
    bVar2 = literalBaseFromChar(cVar1,local_1d + 2);
    if (bVar2) {
      advance(in_RDI);
    }
    else {
      local_1d[2] = 2;
    }
    local_1d[1] = 1;
    local_10 = create<slang::LiteralBase&,bool>
                         (in_stack_00000060,in_stack_0000005e,(LiteralBase *)in_stack_00000050,
                          (bool *)CONCAT26(in_stack_0000004e,in_stack_00000048));
    break;
  case 'X':
  case 'x':
    advance(in_RDI);
    local_10 = create<slang::logic_t_const&>
                         (in_stack_00000050,in_stack_0000004e,(logic_t *)in_stack_00000040);
    break;
  case 'Z':
  case 'z':
    advance(in_RDI);
    local_10 = create<slang::logic_t_const&>
                         (in_stack_00000050,in_stack_0000004e,(logic_t *)in_stack_00000040);
  }
  return local_10;
}

Assistant:

Token Lexer::lexApostrophe() {
    char c = peek();
    switch (c) {
        case '0':
        case '1':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, (logic_t)getDigitValue(c));
        case 'x':
        case 'X':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::x);
        case 'Z':
        case 'z':
            advance();
            return create(TokenKind::UnbasedUnsizedLiteral, logic_t::z);
        case 's':
        case 'S': {
            advance();
            LiteralBase base;
            if (!literalBaseFromChar(peek(), base))
                base = LiteralBase::Decimal;
            else
                advance();
            return create(TokenKind::IntegerBase, base, true);
        }
        default: {
            LiteralBase base;
            if (literalBaseFromChar(peek(), base)) {
                advance();
                return create(TokenKind::IntegerBase, base, false);
            }

            // otherwise just an apostrophe token
            return create(TokenKind::Apostrophe);
        }
    }
}